

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutil.c
# Opt level: O0

void cPrint_SuperNode_Matrix(char *what,SuperMatrix *A)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int_t *rowind_colptr;
  int_t *rowind;
  int *sup_to_col;
  int *col_to_sup;
  float *dp;
  int_t nsup;
  int_t n;
  int_t d;
  int_t c;
  int_t k;
  int_t j;
  int_t i;
  SCformat *Astore;
  SuperMatrix *A_local;
  char *what_local;
  
  printf("\nSuperNode matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  iVar1 = A->ncol;
  piVar4 = (int *)A->Store;
  lVar5 = *(long *)(piVar4 + 2);
  lVar6 = *(long *)(piVar4 + 10);
  lVar7 = *(long *)(piVar4 + 0xc);
  lVar8 = *(long *)(piVar4 + 8);
  lVar9 = *(long *)(piVar4 + 6);
  printf("nrow %d, ncol %d, nnz %lld, nsuper %d\n",(ulong)(uint)A->nrow,(ulong)(uint)A->ncol,
         (long)*piVar4,(ulong)(uint)piVar4[1]);
  printf("nzval:\n");
  for (d = 0; d <= piVar4[1]; d = d + 1) {
    iVar2 = *(int *)(lVar7 + (long)d * 4);
    iVar3 = *(int *)(lVar7 + (long)(d + 1) * 4);
    for (c = iVar2; c < iVar2 + (iVar3 - iVar2); c = c + 1) {
      nsup = *(int_t *)(*(long *)(piVar4 + 4) + (long)c * 4);
      for (k = *(int_t *)(lVar8 + (long)iVar2 * 4); k < *(int *)(lVar8 + (long)(iVar2 + 1) * 4);
          k = k + 1) {
        printf("%d\t%d\t%e\t%e\n",(double)*(float *)(lVar5 + (long)nsup * 4),
               (double)*(float *)(lVar5 + (long)(nsup + 1) * 4),
               (ulong)*(uint *)(lVar9 + (long)k * 4),(ulong)(uint)c);
        nsup = nsup + 2;
      }
    }
  }
  printf("\nnzval_colptr: ");
  for (k = 0; k <= iVar1; k = k + 1) {
    printf("%lld  ",(long)*(int *)(*(long *)(piVar4 + 4) + (long)k * 4));
  }
  printf("\nrowind: ");
  k = 0;
  while( true ) {
    if (*(int *)(*(long *)(piVar4 + 8) + (long)iVar1 * 4) <= k) break;
    printf("%lld  ",(long)*(int *)(*(long *)(piVar4 + 6) + (long)k * 4));
    k = k + 1;
  }
  printf("\nrowind_colptr: ");
  for (k = 0; k <= iVar1; k = k + 1) {
    printf("%lld  ",(long)*(int *)(*(long *)(piVar4 + 8) + (long)k * 4));
  }
  printf("\ncol_to_sup: ");
  for (k = 0; k < iVar1; k = k + 1) {
    printf("%d  ",(ulong)*(uint *)(lVar6 + (long)k * 4));
  }
  printf("\nsup_to_col: ");
  for (k = 0; k <= piVar4[1] + 1; k = k + 1) {
    printf("%d  ",(ulong)*(uint *)(lVar7 + (long)k * 4));
  }
  printf("\n");
  fflush(_stdout);
  return;
}

Assistant:

void
cPrint_SuperNode_Matrix(char *what, SuperMatrix *A)
{
    SCformat     *Astore;
    register int_t i, j, k, c, d, n, nsup;
    float       *dp;
    int *col_to_sup, *sup_to_col;
    int_t *rowind, *rowind_colptr;
    
    printf("\nSuperNode matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    n = A->ncol;
    Astore = (SCformat *) A->Store;
    dp = (float *) Astore->nzval;
    col_to_sup = Astore->col_to_sup;
    sup_to_col = Astore->sup_to_col;
    rowind_colptr = Astore->rowind_colptr;
    rowind = Astore->rowind;
    printf("nrow %d, ncol %d, nnz %lld, nsuper %d\n", 
	   (int)A->nrow, (int)A->ncol, (long long) Astore->nnz, (int)Astore->nsuper);
    printf("nzval:\n");
    for (k = 0; k <= Astore->nsuper; ++k) {
      c = sup_to_col[k];
      nsup = sup_to_col[k+1] - c;
      for (j = c; j < c + nsup; ++j) {
	d = Astore->nzval_colptr[j];
	for (i = rowind_colptr[c]; i < rowind_colptr[c+1]; ++i) {
	  printf("%d\t%d\t%e\t%e\n", (int)rowind[i], (int) j, dp[d], dp[d+1]);
          d += 2;	
	}
      }
    }
#if 0
    for (i = 0; i < 2*Astore->nzval_colptr[n]; ++i) printf("%f  ", dp[i]);
#endif
    printf("\nnzval_colptr: ");
    for (i = 0; i <= n; ++i) printf("%lld  ", (long long)Astore->nzval_colptr[i]);
    printf("\nrowind: ");
    for (i = 0; i < Astore->rowind_colptr[n]; ++i) 
        printf("%lld  ", (long long)Astore->rowind[i]);
    printf("\nrowind_colptr: ");
    for (i = 0; i <= n; ++i) printf("%lld  ", (long long)Astore->rowind_colptr[i]);
    printf("\ncol_to_sup: ");
    for (i = 0; i < n; ++i) printf("%d  ", col_to_sup[i]);
    printf("\nsup_to_col: ");
    for (i = 0; i <= Astore->nsuper+1; ++i) 
        printf("%d  ", sup_to_col[i]);
    printf("\n");
    fflush(stdout);
}